

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

ScriptBuilder * __thiscall
cfd::core::ScriptBuilder::AppendOperator(ScriptBuilder *this,ScriptOperator *operate_object)

{
  ScriptType SVar1;
  value_type local_19;
  ScriptOperator *local_18;
  ScriptOperator *operate_object_local;
  ScriptBuilder *this_local;
  
  local_18 = operate_object;
  operate_object_local = (ScriptOperator *)this;
  SVar1 = ScriptOperator::GetDataType(operate_object);
  local_19 = (value_type)SVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->script_byte_array_,
             &local_19);
  return this;
}

Assistant:

ScriptBuilder& ScriptBuilder::AppendOperator(
    const ScriptOperator& operate_object) {
  script_byte_array_.push_back(
      static_cast<uint8_t>(operate_object.GetDataType()));
  return *this;
}